

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool SQVM::IsFalse(SQObjectPtr *o)

{
  float fVar1;
  SQObjectPtr *o_local;
  
  if (((((((o->super_SQObject)._type & 0x1000000) == 0) || ((o->super_SQObject)._type != OT_FLOAT))
       || (fVar1 = (o->super_SQObject)._unVal.fFloat, fVar1 != 0.0)) || (NAN(fVar1))) &&
     ((o->super_SQObject)._unVal.pTable != (SQTable *)0x0)) {
    o_local._7_1_ = false;
  }
  else {
    o_local._7_1_ = true;
  }
  return o_local._7_1_;
}

Assistant:

bool SQVM::IsFalse(SQObjectPtr &o)
{
    if(((sq_type(o) & SQOBJECT_CANBEFALSE)
        && ( ((sq_type(o) == OT_FLOAT) && (_float(o) == SQFloat(0.0))) ))
#if !defined(SQUSEDOUBLE) || (defined(SQUSEDOUBLE) && defined(_SQ64))
        || (_integer(o) == 0) )  //OT_NULL|OT_INTEGER|OT_BOOL
#else
        || (((type(o) != OT_FLOAT) && (_integer(o) == 0))) )  //OT_NULL|OT_INTEGER|OT_BOOL
#endif
    {
        return true;
    }
    return false;
}